

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall wallet::LegacyScriptPubKeyMan::NewKeyPool(LegacyScriptPubKeyMan *this)

{
  _Rb_tree_header *p_Var1;
  WalletStorage *pWVar2;
  char cVar3;
  int iVar4;
  WalletDatabase *pWVar5;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  WalletBatch local_50;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  undefined4 extraout_var;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
  if ((char)iVar4 == '\0') {
    local_40._M_device =
         &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
          super_recursive_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_40);
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
    (*pWVar5->_vptr_WalletDatabase[0xe])(&local_50,pWVar5,1);
    p_Var6 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var1 = &(this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header;
    local_50.m_database = pWVar5;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        WalletBatch::ErasePool(&local_50,*(int64_t *)(p_Var6 + 1));
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
              (&(this->super_LegacyDataSPKM).setInternalKeyPool._M_t);
    p_Var6 = (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var1 = &(this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        WalletBatch::ErasePool(&local_50,*(int64_t *)(p_Var6 + 1));
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
              (&(this->super_LegacyDataSPKM).setExternalKeyPool._M_t);
    p_Var6 = (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var1 = &(this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        WalletBatch::ErasePool(&local_50,*(int64_t *)(p_Var6 + 1));
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
              (&(this->super_LegacyDataSPKM).set_pre_split_keypool._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
    ::clear(&(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t);
    iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[9])(this,0);
    cVar3 = (char)iVar4;
    if (cVar3 != '\0') {
      ScriptPubKeyMan::WalletLogPrintf<>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<0U>)0x4a2ca2);
    }
    if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
        local_50.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_50.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  }
  else {
    cVar3 = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::NewKeyPool()
{
    if (m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        return false;
    }
    {
        LOCK(cs_KeyStore);
        WalletBatch batch(m_storage.GetDatabase());

        for (const int64_t nIndex : setInternalKeyPool) {
            batch.ErasePool(nIndex);
        }
        setInternalKeyPool.clear();

        for (const int64_t nIndex : setExternalKeyPool) {
            batch.ErasePool(nIndex);
        }
        setExternalKeyPool.clear();

        for (const int64_t nIndex : set_pre_split_keypool) {
            batch.ErasePool(nIndex);
        }
        set_pre_split_keypool.clear();

        m_pool_key_to_index.clear();

        if (!TopUp()) {
            return false;
        }
        WalletLogPrintf("LegacyScriptPubKeyMan::NewKeyPool rewrote keypool\n");
    }
    return true;
}